

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O1

uint __thiscall JsonTest::TestResult::getAssertionNestingLevel(TestResult *this)

{
  uint uVar1;
  PredicateContext *pPVar2;
  
  pPVar2 = &this->rootPredicateNode_;
  uVar1 = 0xffffffff;
  do {
    pPVar2 = pPVar2->next_;
    uVar1 = uVar1 + 1;
  } while (pPVar2 != (PredicateContext *)0x0);
  return uVar1;
}

Assistant:

unsigned int TestResult::getAssertionNestingLevel() const {
  unsigned int level = 0;
  const PredicateContext* lastNode = &rootPredicateNode_;
  while (lastNode->next_ != 0) {
    lastNode = lastNode->next_;
    ++level;
  }
  return level;
}